

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_session.c
# Opt level: O2

ssize_t dlep_session_process_signal(dlep_session *session,void *ptr,size_t length,_Bool is_udp)

{
  size_t *psVar1;
  dlep_extension **ppdVar2;
  avl_node **ppaVar3;
  undefined2 uVar4;
  oonf_log_source oVar5;
  dlep_signals dVar6;
  undefined4 uVar7;
  _func_int_void_ptr_void_ptr *p_Var8;
  undefined8 uVar9;
  uint uVar10;
  byte bVar11;
  ushort uVar12;
  int iVar13;
  undefined8 uVar14;
  long lVar15;
  dlep_parser_value *pdVar16;
  avl_tree *paVar17;
  avl_tree *paVar18;
  long lVar19;
  list_entity *plVar20;
  list_entity *plVar21;
  int32_t iVar22;
  size_t sVar23;
  ushort uVar24;
  size_t __size;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  long lVar30;
  _func_int_void_ptr_void_ptr *p_Var31;
  char *pcVar32;
  ushort local_b2;
  undefined8 local_b0;
  ulong local_a8;
  ulong local_a0;
  dlep_session_parser *local_98;
  ulong local_90;
  ulong local_88;
  uint8_t *local_80;
  ulong local_78;
  netaddr_str nbuf;
  
  session->next_restrict_signal = DLEP_KEEP_RESTRICTION;
  if (length < 4) {
    oVar5 = session->log_source;
    if (((&log_global_mask)[oVar5] & 1) != 0) {
      uVar14 = netaddr_socket_to_string(&nbuf,&session->remote_socket);
      oonf_log(1,(ulong)oVar5,"src/generic/dlep/dlep_session.c",0x186,0,0,
               "Not enough data to process signal from %s (%zu bytes)",uVar14,length);
      return 0;
    }
  }
  else {
    uVar12 = *ptr << 8 | *ptr >> 8;
    uVar10 = uVar12 + 0x10000;
    if (!is_udp) {
      uVar10 = (uint)uVar12;
    }
    uVar27 = (ulong)uVar10;
    uVar28 = (ulong)(ushort)(*(ushort *)((long)ptr + 2) << 8 | *(ushort *)((long)ptr + 2) >> 8);
    uVar25 = uVar28 + 4;
    uVar29 = (ulong)session->log_source;
    if (uVar25 <= length) {
      local_a8 = uVar27;
      if (((&log_global_mask)[uVar29] & 1) != 0) {
        uVar14 = netaddr_socket_to_string(&nbuf,&session->remote_socket);
        oonf_log(1,uVar29,"src/generic/dlep/dlep_session.c",0x1a3,ptr,uVar25,
                 "Process signal %d from %s (%zu bytes)",local_a8,uVar14,length);
      }
      dVar6 = session->restrict_signal;
      uVar27 = (ulong)(uint)dVar6;
      if ((dVar6 == DLEP_ALL_SIGNALS) || (dVar6 == (dlep_signals)local_a8)) {
        local_80 = (uint8_t *)((long)ptr + 4);
        local_98 = &session->parser;
        (session->parser).tlv_ptr = local_80;
        plVar20 = (list_entity *)local_98;
        while (plVar20 = (((avl_tree *)&plVar20->next)->list_head).next,
              plVar20->prev != (session->parser).allowed_tlvs.list_head.prev) {
          *(undefined8 *)((long)&plVar20[-2].prev + 4) = 0xffffffffffffffff;
        }
        __size = 0x400;
        local_b0 = 0xfffffffffffffffe;
        sVar23 = 0;
        uVar27 = 0;
        local_90 = uVar28;
        while (uVar27 < local_90) {
          if (local_90 - uVar27 < 4) {
LAB_001097f2:
            uVar27 = (ulong)session->log_source;
            if (((&log_global_mask)[uVar27] & 1) != 0) {
              pcVar32 = "parse_tlvstream result: %d";
              uVar14 = 0x329;
LAB_00109823:
              oonf_log(1,uVar27,"src/generic/dlep/dlep_session.c",uVar14,0,0,pcVar32,local_b0);
            }
LAB_00109833:
            if (((&log_global_mask)[session->log_source] & 4) != 0) {
              oonf_log(4,(ulong)session->log_source,"src/generic/dlep/dlep_session.c",0x1b5,0,0,
                       "Parser error: %d",local_b0);
            }
            if ((uint)(session->restrict_signal + ~DLEP_IS_UDP_SIGNAL) < 2) {
              return uVar25;
            }
            dlep_session_generate_signal_status
                      (session,5,(oonf_layer2_neigh_key *)0x0,DLEP_STATUS_INVALID_DATA,
                       "Incoming signal could not be parsed");
            session->restrict_signal = DLEP_SESSION_TERMINATION_ACK;
            session->next_restrict_signal = DLEP_SESSION_TERMINATION_ACK;
            return uVar25;
          }
          uVar12 = *(ushort *)(local_80 + uVar27) << 8 | *(ushort *)(local_80 + uVar27) >> 8;
          uVar24 = *(ushort *)(local_80 + uVar27 + 2) << 8 | *(ushort *)(local_80 + uVar27 + 2) >> 8
          ;
          uVar28 = uVar27 + uVar24 + 4;
          if (local_90 < uVar28) {
            local_b0 = 0xfffffffffffffffd;
            if (((&log_global_mask)[session->log_source] & 4) != 0) {
              oonf_log(4,(ulong)session->log_source,"src/generic/dlep/dlep_session.c",0x381,0,0,
                       "TLV %u incomplete: %zu > %zu",(ulong)uVar12,uVar28,local_90);
            }
            goto LAB_001097f2;
          }
          local_b2 = uVar12;
          local_a0 = (ulong)uVar12;
          local_88 = (ulong)uVar24;
          local_78 = uVar28;
          lVar15 = avl_find(local_98,&local_b2);
          if (lVar15 == 0) {
            local_b0 = 0xfffffffffffffffc;
            if (((&log_global_mask)[session->log_source] & 2) != 0) {
              oonf_log(2,(ulong)session->log_source,"src/generic/dlep/dlep_session.c",0x388,0,0,
                       "Unsupported TLV %u",local_a0);
            }
            goto LAB_001097f2;
          }
          if ((*(ushort *)(lVar15 + -10) < uVar24) || (uVar24 < *(ushort *)(lVar15 + -0xc))) {
            local_b0 = 0xfffffffffffffffb;
            if (((&log_global_mask)[session->log_source] & 4) != 0) {
              oonf_log(4,(ulong)session->log_source,"src/generic/dlep/dlep_session.c",0x391,0,0,
                       "TLV %u has wrong size, %d is not between %u and %u",local_a0,local_88,
                       *(undefined2 *)(lVar15 + -0xc),*(ushort *)(lVar15 + -10));
            }
            goto LAB_001097f2;
          }
          if (sVar23 == (session->parser).value_max_count) {
            pdVar16 = (dlep_parser_value *)realloc((session->parser).values,__size);
            if (pdVar16 == (dlep_parser_value *)0x0) {
              local_b0 = 0xfffffffffffffff8;
              goto LAB_001097f2;
            }
            psVar1 = &(session->parser).value_max_count;
            *psVar1 = *psVar1 + 0x80;
            (session->parser).values = pdVar16;
          }
          if (((&log_global_mask)[session->log_source] & 1) != 0) {
            oonf_log(1,(ulong)session->log_source,"src/generic/dlep/dlep_session.c",0x3a0,
                     local_80 + uVar27 + 4,local_88,"Received TLV %u",local_a0);
          }
          pdVar16 = (session->parser).values;
          *(undefined4 *)((long)&pdVar16[-0x80].tlv_next + __size) = 0xffffffff;
          *(short *)((long)pdVar16 + (__size - 0x3fc)) = (short)(uVar27 + 4);
          *(ushort *)((long)pdVar16 + (__size - 0x3fa)) = uVar24;
          iVar22 = (int32_t)sVar23;
          if ((long)*(int *)(lVar15 + -0x10) == -1) {
            *(int32_t *)(lVar15 + -0x14) = iVar22;
          }
          else {
            (session->parser).values[*(int *)(lVar15 + -0x10)].tlv_next = iVar22;
          }
          *(int32_t *)(lVar15 + -0x10) = iVar22;
          sVar23 = sVar23 + 1;
          __size = __size + 8;
          uVar27 = local_78;
        }
        paVar17 = dlep_extension_get_tree();
LAB_0010954a:
        do {
          plVar21 = (list_entity *)0xffffffffffffffff;
          paVar17 = (avl_tree *)(paVar17->list_head).next;
          plVar20 = (paVar17->list_head).prev;
          paVar18 = dlep_extension_get_tree();
          if (plVar20 == (paVar18->list_head).prev) {
            if (session->next_restrict_signal == DLEP_KEEP_RESTRICTION) {
              return uVar25;
            }
            session->restrict_signal = session->next_restrict_signal;
            return uVar25;
          }
          ppaVar3 = &paVar17[-4].root;
          sVar23 = 0;
          do {
            if ((session->parser).extension_count == sVar23) goto LAB_0010954a;
            ppdVar2 = (session->parser).extensions + sVar23;
            sVar23 = sVar23 + 1;
          } while (*ppdVar2 != (dlep_extension *)ppaVar3);
          plVar20 = paVar17[-3].list_head.next;
          lVar15 = -0x40;
          do {
            lVar26 = lVar15;
            plVar21 = (list_entity *)((long)&plVar21->next + 1);
            if (plVar20 == plVar21) goto LAB_0010960c;
            lVar15 = lVar26 + 0x58;
            p_Var31 = paVar17[-4].comp;
          } while (*(int *)(p_Var31 + lVar26 + 0x40) != (int)local_a8);
          for (uVar27 = 0; uVar27 < *(ulong *)(p_Var31 + lVar26 + 0x60); uVar27 = uVar27 + 1) {
            local_b2 = *(ushort *)(*(long *)(p_Var31 + lVar15) + uVar27 * 2);
            lVar19 = avl_find(local_98);
            if (lVar19 == 0) {
              uVar28 = (ulong)session->log_source;
              local_b0 = 0xfffffffffffffff7;
              if (((&log_global_mask)[uVar28] & 4) != 0) {
                uVar4 = *(undefined2 *)(*(long *)(p_Var31 + lVar15) + uVar27 * 2);
                uVar7 = *(undefined4 *)ppaVar3;
                pcVar32 = "Could not find tlv data for mandatory TLV %u in extension %d";
                uVar14 = 0x3dc;
LAB_00109a0b:
                oonf_log(4,uVar28,"src/generic/dlep/dlep_session.c",uVar14,0,0,pcVar32,uVar4,uVar7);
              }
LAB_00109a26:
              uVar27 = (ulong)session->log_source;
              if (((&log_global_mask)[uVar27] & 1) == 0) goto LAB_00109833;
              pcVar32 = "check_mandatory result: %d";
              uVar14 = 0x30a;
              goto LAB_00109823;
            }
            if (*(int *)(lVar19 + -0x14) == -1) {
              uVar28 = (ulong)session->log_source;
              local_b0 = 0xfffffffffffffffa;
              if (((&log_global_mask)[uVar28] & 4) != 0) {
                uVar4 = *(undefined2 *)(*(long *)(p_Var31 + lVar15) + uVar27 * 2);
                uVar7 = *(undefined4 *)ppaVar3;
                pcVar32 = "Missing mandatory TLV %u in extension %d";
                uVar14 = 0x3e4;
                goto LAB_00109a0b;
              }
              goto LAB_00109a26;
            }
          }
          plVar20 = paVar17[-3].list_head.next;
LAB_0010960c:
          plVar21 = (list_entity *)0xffffffffffffffff;
          iVar13 = (int)local_a8;
          p_Var31 = (_func_int_void_ptr_void_ptr *)0x0;
          lVar26 = 0;
          lVar15 = -0x58;
          do {
            plVar21 = (list_entity *)((long)&plVar21->next + 1);
            if (plVar20 == plVar21) {
              if (p_Var31 == (_func_int_void_ptr_void_ptr *)0x0) goto LAB_001096aa;
              goto LAB_00109649;
            }
            lVar19 = lVar15 + 0x58;
            p_Var8 = paVar17[-4].comp;
            lVar30 = lVar26 * 0x58;
            lVar26 = lVar26 + 1;
            p_Var31 = p_Var8 + lVar30;
            lVar30 = lVar15 + 0x58;
            lVar15 = lVar19;
          } while (*(int *)(p_Var8 + lVar30) != iVar13);
          p_Var31 = p_Var8 + lVar19;
LAB_00109649:
          for (uVar27 = 0; iVar13 = (int)local_a8, uVar27 < *(ulong *)(p_Var31 + 0x10);
              uVar27 = uVar27 + 1) {
            lVar15 = avl_find(local_98);
            if ((lVar15 != 0) && (*(int *)(lVar15 + -0x14) != *(int *)(lVar15 + -0x10))) {
              lVar26 = 0;
              do {
                if (*(long *)(p_Var31 + 0x30) == lVar26) {
                  uVar27 = (ulong)session->log_source;
                  bVar11 = (&log_global_mask)[uVar27];
                  if ((bVar11 & 4) != 0) {
                    oonf_log(4,uVar27,"src/generic/dlep/dlep_session.c",0x41a,0,0,
                             "Duplicate not allowed for TLV %u in extension %d",
                             *(short *)(lVar15 + -0x18),*(undefined4 *)ppaVar3);
                    uVar27 = (ulong)session->log_source;
                    bVar11 = (&log_global_mask)[uVar27];
                  }
                  local_b0 = 0xfffffffffffffff9;
                  if ((bVar11 & 1) == 0) goto LAB_00109833;
                  pcVar32 = "check_duplicate result: %d";
                  uVar14 = 0x30e;
                  goto LAB_00109823;
                }
                lVar19 = lVar26 * 2;
                lVar26 = lVar26 + 1;
              } while (*(short *)(*(long *)(p_Var31 + 0x28) + lVar19) != *(short *)(lVar15 + -0x18))
              ;
            }
          }
          plVar20 = paVar17[-3].list_head.next;
LAB_001096aa:
          plVar20 = (list_entity *)((long)&plVar20->next + 1);
          lVar15 = 0;
          do {
            lVar26 = lVar15;
            plVar20 = (list_entity *)((long)(plVar20 + 0xffffffffffffffff) + 0xf);
            if (plVar20 == (list_entity *)0x0) goto LAB_0010954a;
            p_Var31 = paVar17[-4].comp;
            lVar15 = lVar26 + 0x58;
          } while (*(int *)(p_Var31 + lVar26) != iVar13);
          if (session->radio != true) {
            if ((*(code **)(p_Var31 + lVar26 + 0x40) != (code *)0x0) &&
               (iVar13 = (**(code **)(p_Var31 + lVar26 + 0x40))(ppaVar3), iVar13 != 0)) {
              uVar25 = (ulong)session->log_source;
              if (((&log_global_mask)[uVar25] & 1) == 0) goto LAB_00109ab7;
              pcVar32 = "Error in router signal processing of extension \'%s\'";
              uVar14 = 0x439;
              goto LAB_00109a9e;
            }
            goto LAB_0010954a;
          }
        } while ((*(code **)(p_Var31 + lVar26 + 0x38) == (code *)0x0) ||
                (iVar13 = (**(code **)(p_Var31 + lVar26 + 0x38))(ppaVar3), iVar13 == 0));
        uVar25 = (ulong)session->log_source;
        if (((&log_global_mask)[uVar25] & 1) != 0) {
          pcVar32 = "Error in radio signal processing of extension \'%s\'";
          uVar14 = 0x433;
LAB_00109a9e:
          uVar9._0_4_ = paVar17[-4].count;
          uVar9._4_1_ = paVar17[-4].allow_dups;
          uVar9._5_3_ = *(undefined3 *)&paVar17[-4].field_0x1d;
          oonf_log(1,uVar25,"src/generic/dlep/dlep_session.c",uVar14,0,0,pcVar32,uVar9);
        }
LAB_00109ab7:
        uVar25 = (ulong)session->log_source;
        if (((&log_global_mask)[uVar25] & 1) == 0) {
          return 0xffffffffffffffff;
        }
        pcVar32 = "extension processing failed: %d";
        uVar27 = 0xffffffffffffffff;
        uVar14 = 0x313;
      }
      else {
        uVar25 = (ulong)session->log_source;
        if (((&log_global_mask)[uVar25] & 1) == 0) {
          return 0xffffffffffffffff;
        }
        uVar14 = 0x1a9;
        pcVar32 = "Signal should have been %d, drop session";
      }
      oonf_log(1,uVar25,"src/generic/dlep/dlep_session.c",uVar14,0,0,pcVar32,uVar27);
      return 0xffffffffffffffff;
    }
    if (((&log_global_mask)[uVar29] & 1) != 0) {
      uVar14 = netaddr_socket_to_string(&nbuf,&session->remote_socket);
      oonf_log(1,uVar29,"src/generic/dlep/dlep_session.c",0x19d,0,0,
               "Not enough data to process signal %u (length %u) from %s (%zu bytes)",uVar27,uVar28,
               uVar14,length);
      return 0;
    }
  }
  return 0;
}

Assistant:

ssize_t
dlep_session_process_signal(struct dlep_session *session, const void *ptr, size_t length, bool is_udp) {
  enum dlep_parser_error result;
  uint16_t original_signal_type;
  int32_t signal_type;
  uint16_t signal_length;
  const uint8_t *buffer;
#ifdef OONF_LOG_DEBUG_INFO
  struct netaddr_str nbuf;
#endif

  session->next_restrict_signal = DLEP_KEEP_RESTRICTION;

  if (length < 4) {
    /* not enough data for a signal type */
    OONF_DEBUG(session->log_source,
      "Not enough data to process"
      " signal from %s (%" PRINTF_SIZE_T_SPECIFIER " bytes)",
      netaddr_socket_to_string(&nbuf, &session->remote_socket), length);

    return 0;
  }

  buffer = ptr;

  /* copy data */
  memcpy(&original_signal_type, &buffer[0], sizeof(original_signal_type));
  memcpy(&signal_length, &buffer[2], sizeof(signal_length));
  signal_type = ntohs(original_signal_type);
  signal_length = ntohs(signal_length);

  if (is_udp) {
    signal_type += DLEP_IS_UDP_SIGNAL;
  }

  if (length < (size_t)signal_length + 4u) {
    /* not enough data for signal */
    OONF_DEBUG(session->log_source,
      "Not enough data to process"
      " signal %u (length %u) from %s"
      " (%" PRINTF_SIZE_T_SPECIFIER " bytes)",
      signal_type, signal_length, netaddr_socket_to_string(&nbuf, &session->remote_socket), length);
    return 0;
  }

  OONF_DEBUG_HEX(session->log_source, buffer, signal_length + 4,
    "Process signal %d from %s (%" PRINTF_SIZE_T_SPECIFIER " bytes)", signal_type,
    netaddr_socket_to_string(&nbuf, &session->remote_socket), length);

  if (session->restrict_signal != DLEP_ALL_SIGNALS && session->restrict_signal != signal_type) {
    OONF_DEBUG(session->log_source,
      "Signal should have been %d,"
      " drop session",
      session->restrict_signal);
    /* we only accept a single type and we got the wrong one */
    return -1;
  }

  result = _process_tlvs(session, signal_type, signal_length, &buffer[4]);

  if (result == DLEP_NEW_PARSER_TERMINDATED) {
    /* session is now invalid, end parser */
    return result;
  }
  if (result != DLEP_NEW_PARSER_OKAY) {
    OONF_WARN(session->log_source, "Parser error: %d", result);
    _send_terminate(session, DLEP_STATUS_INVALID_DATA, "Incoming signal could not be parsed");
  }
  else if (session->next_restrict_signal != DLEP_KEEP_RESTRICTION) {
    session->restrict_signal = session->next_restrict_signal;
  }

  /* skip forward */
  return signal_length + 4;
}